

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_gpio_function_out(APITests *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,-1);
  iVar1 = GPIO::gpio_function((this->pin_data).out_a);
  std::__cxx11::string::string((string *)&local_30,"",&local_31);
  assert::is_true(iVar1 == 1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  GPIO::cleanup();
  return;
}

Assistant:

void test_gpio_function_out()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT);
        auto val = GPIO::gpio_function(pin_data.out_a);
        assert::is_true(val == GPIO::Directions::OUT);
        GPIO::cleanup();
    }